

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Version::MergeFrom(Version *this,Version *from)

{
  uint uVar1;
  Version *pVVar2;
  LogMessage *other;
  uint32_t *puVar3;
  Arena *pAVar4;
  LogFinisher local_75;
  uint32_t cached_has_bits;
  byte local_61;
  LogMessage local_60;
  Version *local_28;
  Version *from_local;
  Version *this_local;
  Version *local_10;
  
  local_61 = 0;
  local_28 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x1e0);
    local_61 = 1;
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  puVar3 = internal::HasBits<1UL>::operator[](&local_28->_has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      this_local = (Version *)_internal_suffix_abi_cxx11_(local_28);
      local_10 = this;
      puVar3 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
      pVVar2 = this_local;
      *puVar3 = *puVar3 | 1;
      pAVar4 = MessageLite::GetArenaForAllocation((MessageLite *)this);
      internal::ArenaStringPtr::Set(&this->suffix_,pVVar2,pAVar4);
    }
    if ((uVar1 & 2) != 0) {
      this->major_ = local_28->major_;
    }
    if ((uVar1 & 4) != 0) {
      this->minor_ = local_28->minor_;
    }
    if ((uVar1 & 8) != 0) {
      this->patch_ = local_28->patch_;
    }
    puVar3 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(local_28->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void Version::MergeFrom(const Version& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.Version)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_suffix(from._internal_suffix());
    }
    if (cached_has_bits & 0x00000002u) {
      major_ = from.major_;
    }
    if (cached_has_bits & 0x00000004u) {
      minor_ = from.minor_;
    }
    if (cached_has_bits & 0x00000008u) {
      patch_ = from.patch_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}